

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpix_manager.c
# Opt level: O0

int write_tpix(int coff,opj_codestream_info_t cstr_info,int j2klen,opj_cio_t *cio)

{
  opj_codestream_info_t cstr_info_00;
  int pos;
  int iVar1;
  opj_cio_t *in_RDX;
  undefined8 in_stack_00000008;
  unsigned_long_long in_stack_00000010;
  opj_cio_t *in_stack_00000018;
  opj_cio_t *in_stack_00000020;
  int in_stack_0000002c;
  int in_stack_00000030;
  int in_stack_00000034;
  int lenp;
  undefined1 in_stack_00000040 [72];
  int len;
  undefined4 uStack0000000000000098;
  undefined4 uStack000000000000009c;
  undefined8 in_stack_ffffffffffffff68;
  unsigned_long_long in_stack_ffffffffffffff70;
  opj_cio_t *in_stack_ffffffffffffff78;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  pos = cio_tell(in_RDX);
  cio_skip(in_RDX,4);
  cio_write(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,iVar1);
  cstr_info_00._72_8_ = cio;
  cstr_info_00._0_72_ = in_stack_00000040;
  cstr_info_00.marker._0_4_ = j2klen;
  cstr_info_00.marker._4_4_ = coff;
  cstr_info_00.maxmarknum = uStack0000000000000098;
  cstr_info_00.main_head_start = uStack000000000000009c;
  cstr_info_00._96_16_ = cstr_info._0_16_;
  write_tpixfaix(in_stack_00000034,in_stack_00000030,cstr_info_00,in_stack_0000002c,
                 in_stack_00000020);
  iVar1 = cio_tell(in_RDX);
  cio_seek(in_RDX,pos);
  cio_write(in_stack_00000018,in_stack_00000010,in_stack_00000008._4_4_);
  cio_seek(in_RDX,pos + (iVar1 - pos));
  return iVar1 - pos;
}

Assistant:

int write_tpix( int coff, opj_codestream_info_t cstr_info, int j2klen, opj_cio_t *cio)
{
  int len, lenp;
  lenp = cio_tell( cio);
  cio_skip( cio, 4);              /* L [at the end] */
  cio_write( cio, JPIP_TPIX, 4);  /* TPIX           */
  
  write_tpixfaix( coff, 0, cstr_info, j2klen, cio);

  len = cio_tell( cio)-lenp;
  cio_seek( cio, lenp);
  cio_write( cio, len, 4);        /* L              */
  cio_seek( cio, lenp+len);

  return len;
}